

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error
ft_stroke_border_lineto(PVG_FT_StrokeBorder border,PVG_FT_Vector *to,PVG_FT_Bool movable)

{
  PVG_FT_UInt PVar1;
  uint uVar2;
  uint uVar3;
  PVG_FT_Vector *pPVar4;
  PVG_FT_Byte *pPVar5;
  PVG_FT_Byte *tag;
  PVG_FT_Vector *vec;
  PVG_FT_Error error;
  PVG_FT_Bool movable_local;
  PVG_FT_Vector *to_local;
  PVG_FT_StrokeBorder border_local;
  
  vec._0_4_ = 0;
  if (border->start < 0) {
    __assert_fail("border->start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-ft-stroker.c"
                  ,0x148,
                  "PVG_FT_Error ft_stroke_border_lineto(PVG_FT_StrokeBorder, PVG_FT_Vector *, PVG_FT_Bool)"
                 );
  }
  if (border->movable == '\0') {
    if (((((uint)border->start < border->num_points) &&
         (-2 < border->points[border->num_points - 1].x - to->x)) &&
        (border->points[border->num_points - 1].x - to->x < 2)) &&
       ((-2 < border->points[border->num_points - 1].y - to->y &&
        (border->points[border->num_points - 1].y - to->y < 2)))) {
      return 0;
    }
    vec._0_4_ = ft_stroke_border_grow(border,1);
    if ((PVG_FT_Error)vec == 0) {
      pPVar4 = border->points;
      uVar2 = border->num_points;
      pPVar5 = border->tags;
      uVar3 = border->num_points;
      pPVar4[uVar2].x = to->x;
      pPVar4[uVar2].y = to->y;
      pPVar5[uVar3] = '\x01';
      border->num_points = border->num_points + 1;
    }
  }
  else {
    pPVar4 = border->points;
    PVar1 = border->num_points;
    pPVar4[PVar1 - 1].x = to->x;
    pPVar4[PVar1 - 1].y = to->y;
  }
  border->movable = movable;
  return (PVG_FT_Error)vec;
}

Assistant:

static PVG_FT_Error ft_stroke_border_lineto(PVG_FT_StrokeBorder border,
                                           PVG_FT_Vector* to, PVG_FT_Bool movable)
{
    PVG_FT_Error error = 0;

    assert(border->start >= 0);

    if (border->movable) {
        /* move last point */
        border->points[border->num_points - 1] = *to;
    } else {
        /* don't add zero-length lineto, but always add moveto */
        if (border->num_points > border->start &&
            PVG_FT_IS_SMALL(border->points[border->num_points - 1].x - to->x) &&
            PVG_FT_IS_SMALL(border->points[border->num_points - 1].y - to->y))
            return error;

        /* add one point */
        error = ft_stroke_border_grow(border, 1);
        if (!error) {
            PVG_FT_Vector* vec = border->points + border->num_points;
            PVG_FT_Byte*   tag = border->tags + border->num_points;

            vec[0] = *to;
            tag[0] = PVG_FT_STROKE_TAG_ON;

            border->num_points += 1;
        }
    }
    border->movable = movable;
    return error;
}